

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O0

void helper_bpt_io_x86_64(CPUX86State *env,uint32_t port,uint32_t size,target_ulong next_eip)

{
  unsigned_long dr7_00;
  _Bool _Var1;
  int iVar2;
  uint local_30;
  int bpt_len;
  int hit;
  int i;
  target_ulong dr7;
  target_ulong next_eip_local;
  uint32_t size_local;
  uint32_t port_local;
  CPUX86State *env_local;
  
  dr7_00 = env->dr[7];
  local_30 = 0;
  for (bpt_len = 0; bpt_len < 4; bpt_len = bpt_len + 1) {
    iVar2 = hw_breakpoint_type(dr7_00,bpt_len);
    if ((((iVar2 == 2) && (_Var1 = hw_breakpoint_enabled(dr7_00,bpt_len), _Var1)) &&
        (iVar2 = hw_breakpoint_len(dr7_00,bpt_len), env->dr[bpt_len] <= (ulong)((port + size) - 1)))
       && ((ulong)port <= (env->dr[bpt_len] + (long)iVar2) - 1)) {
      local_30 = 1 << ((byte)bpt_len & 0x1f) | local_30;
    }
  }
  if (local_30 == 0) {
    return;
  }
  env->dr[6] = env->dr[6] & 0xfffffffffffffff0 | (long)(int)local_30;
  env->eip = next_eip;
  raise_exception_x86_64(env,1);
}

Assistant:

void helper_bpt_io(CPUX86State *env, uint32_t port,
                   uint32_t size, target_ulong next_eip)
{
    target_ulong dr7 = env->dr[7];
    int i, hit = 0;

    for (i = 0; i < DR7_MAX_BP; ++i) {
        if (hw_breakpoint_type(dr7, i) == DR7_TYPE_IO_RW
            && hw_breakpoint_enabled(dr7, i)) {
            int bpt_len = hw_breakpoint_len(dr7, i);
            if (port + size - 1 >= env->dr[i]
                && port <= env->dr[i] + bpt_len - 1) {
                hit |= 1 << i;
            }
        }
    }

    if (hit) {
        env->dr[6] = (env->dr[6] & ~0xf) | hit;
        env->eip = next_eip;
        raise_exception(env, EXCP01_DB);
    }
}